

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O0

SentencePieceNormalizer * __thiscall
sentencepiece::SentencePieceNormalizer::Load(SentencePieceNormalizer *this,string_view filename)

{
  bool bVar1;
  pointer pMVar2;
  undefined8 in_RCX;
  __uniq_ptr_data<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>,_true,_true>
  _Var3;
  unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_> local_60;
  uint local_58;
  char *local_48;
  undefined8 uStack_40;
  byte local_31;
  unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_> local_30;
  __single_object model_proto;
  SentencePieceNormalizer *this_local;
  string_view filename_local;
  Status *_status;
  
  _Var3.
  super___uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>.
  _M_t.
  super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
  .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl =
       (__uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>)
       filename._M_len;
  model_proto._M_t.
  super___uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>.
  _M_t.
  super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
  .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl =
       (__uniq_ptr_data<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>,_true,_true>
        )(__uniq_ptr_data<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>,_true,_true>
          )_Var3.
           super___uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
           ._M_t.
           super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
           .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl;
  std::make_unique<sentencepiece::ModelProto>();
  local_31 = 0;
  local_48 = filename._M_str;
  uStack_40 = in_RCX;
  pMVar2 = std::
           unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
           get(&local_30);
  sentencepiece::io::LoadModelProto(this,local_48,uStack_40,pMVar2);
  bVar1 = util::Status::ok((Status *)this);
  if (!bVar1) {
    local_31 = 1;
  }
  local_58 = (uint)!bVar1;
  if ((local_31 & 1) == 0) {
    sentencepiece::util::Status::~Status((Status *)this);
  }
  if (local_58 == 0) {
    std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
    unique_ptr(&local_60,&local_30);
    (**(code **)(*(long *)_Var3.
                          super___uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
                          .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl +
                0x10))(this,_Var3.
                            super___uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
                            .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl,
                       &local_60);
    std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
    ~unique_ptr(&local_60);
    local_58 = 1;
  }
  std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
  ~unique_ptr(&local_30);
  return this;
}

Assistant:

util::Status SentencePieceNormalizer::Load(absl::string_view filename) {
  auto model_proto = std::make_unique<ModelProto>();
  RETURN_IF_ERROR(io::LoadModelProto(filename, model_proto.get()));
  return Load(std::move(model_proto));
}